

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_retry_request(Curl_easy *data,char **url)

{
  int iVar1;
  connectdata *conn_00;
  bool bVar2;
  char *pcVar3;
  _Bool retry;
  connectdata *conn;
  char **url_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  bVar2 = false;
  *url = (char *)0x0;
  if (((*(uint *)&(data->state).field_0x7be >> 0x13 & 1) != 0) &&
     ((conn_00->handler->protocol & 0xc0040003) == 0)) {
    return CURLE_OK;
  }
  if (((((data->req).bytecount + (ulong)(data->req).headerbytecount == 0) &&
       (((ulong)conn_00->bits >> 6 & 1) != 0)) &&
      (((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) == 0 ||
       ((conn_00->handler->protocol & 0xc0000003) != 0)))) &&
     ((data->set).rtspreq != RTSPREQ_RECEIVE)) {
    bVar2 = true;
  }
  else if (((*(uint *)&(data->state).field_0x7be >> 4 & 1) != 0) &&
          ((data->req).bytecount + (ulong)(data->req).headerbytecount == 0)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"REFUSED_STREAM, retrying a fresh connect");
    }
    *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffffef;
    bVar2 = true;
  }
  if (bVar2) {
    iVar1 = (data->state).retrycount;
    (data->state).retrycount = iVar1 + 1;
    if (4 < iVar1) {
      Curl_failf(data,"Connection died, tried %d times before giving up",5);
      (data->state).retrycount = 0;
      return CURLE_SEND_ERROR;
    }
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Connection died, retrying a fresh connect (retry count: %d)",
                 (ulong)(uint)(data->state).retrycount);
    }
    pcVar3 = (*Curl_cstrdup)((data->state).url);
    *url = pcVar3;
    if (*url == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_conncontrol(conn_00,1);
    conn_00->bits = (ConnectBits)((ulong)conn_00->bits & 0xffffffffffffbfff | 0x4000);
    Curl_creader_set_rewind(data,true);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_retry_request(struct Curl_easy *data, char **url)
{
  struct connectdata *conn = data->conn;
  bool retry = FALSE;
  *url = NULL;

  /* if we are talking upload, we cannot do the checks below, unless the
     protocol is HTTP as when uploading over HTTP we will still get a
     response */
  if(data->state.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
     conn->bits.reuse &&
     (!data->req.no_body || (conn->handler->protocol & PROTO_FAMILY_HTTP))
#ifndef CURL_DISABLE_RTSP
     && (data->set.rtspreq != RTSPREQ_RECEIVE)
#endif
    )
    /* We got no data, we attempted to reuse a connection. For HTTP this
       can be a retry so we try again regardless if we expected a body.
       For other protocols we only try again only if we expected a body.

       This might happen if the connection was left alive when we were
       done using it before, but that was closed when we wanted to read from
       it again. Bad luck. Retry the same request on a fresh connect! */
    retry = TRUE;
  else if(data->state.refused_stream &&
          (data->req.bytecount + data->req.headerbytecount == 0) ) {
    /* This was sent on a refused stream, safe to rerun. A refused stream
       error can typically only happen on HTTP/2 level if the stream is safe
       to issue again, but the nghttp2 API can deliver the message to other
       streams as well, which is why this adds the check the data counters
       too. */
    infof(data, "REFUSED_STREAM, retrying a fresh connect");
    data->state.refused_stream = FALSE; /* clear again */
    retry = TRUE;
  }
  if(retry) {
#define CONN_MAX_RETRIES 5
    if(data->state.retrycount++ >= CONN_MAX_RETRIES) {
      failf(data, "Connection died, tried %d times before giving up",
            CONN_MAX_RETRIES);
      data->state.retrycount = 0;
      return CURLE_SEND_ERROR;
    }
    infof(data, "Connection died, retrying a fresh connect (retry count: %d)",
          data->state.retrycount);
    *url = strdup(data->state.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we are about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */
    Curl_creader_set_rewind(data, TRUE);
  }
  return CURLE_OK;
}